

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClusterList.h
# Opt level: O2

void __thiscall
SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U>::EnsureBaseSize
          (SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U> *this,uint inputMax)

{
  uint **obj;
  uint uVar1;
  uint **ppuVar2;
  uint i_1;
  uint uVar3;
  ulong uVar4;
  uint i;
  ulong uVar5;
  uint uVar6;
  ulong count;
  
  uVar3 = inputMax + 1 & 0xf;
  uVar1 = (inputMax - uVar3) + 0x11;
  if (uVar3 == 0) {
    uVar1 = inputMax + 1;
  }
  uVar3 = uVar1 >> 4;
  uVar6 = this->maxIndex >> 4;
  count = (ulong)uVar6;
  if (uVar3 <= uVar6) {
    return;
  }
  ppuVar2 = Memory::AllocateArray<Memory::JitArenaAllocator,unsigned_int*,false>
                      ((Memory *)this->alloc,(JitArenaAllocator *)Memory::JitArenaAllocator::Alloc,0
                       ,(ulong)uVar3);
  for (uVar5 = 0; uVar4 = count, count != uVar5; uVar5 = uVar5 + 1) {
    ppuVar2[uVar5] = this->backingStore[uVar5];
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    ppuVar2[uVar4] = (uint *)0x0;
  }
  this->maxIndex = uVar1;
  obj = this->backingStore;
  this->backingStore = ppuVar2;
  Memory::DeleteArray<Memory::JitArenaAllocator,unsigned_int*>(this->alloc,count,obj);
  return;
}

Assistant:

inline void EnsureBaseSize(indexType inputMax)
    {
        // We want to ensure that we can store to inputMax, which means we need to grow to inputMax+1
        indexType targetSize = inputMax + 1;
        // round up to the next numPerSegment multiple
        indexType max = (targetSize % numPerSegment == 0) ? targetSize : (targetSize + numPerSegment - (targetSize % numPerSegment));
        // get segment counts for allocation
        indexType newNumSegments = max / numPerSegment;
        indexType curNumSegments = maxIndex / numPerSegment;
        if (newNumSegments > curNumSegments)
        {
            // Note that if you want to use this with something other than an ArenaAllocator, then
            // you'll have to add clean-up mechanics
            indexType **tempList = AllocatorNewArray(TAllocator, alloc, indexType*, newNumSegments);
            for (indexType i = 0; i < curNumSegments; i++)
            {
                tempList[i] = backingStore[i];
            }
            for (indexType i = curNumSegments; i < newNumSegments; i++)
            {
                tempList[i] = nullptr;
            }
            // Set the max index to the number of supported indicies
            maxIndex = max;
            // replace the backingStore with the new backing Store
            indexType **oldBackingStore = backingStore;
            backingStore = tempList;
            AllocatorDeleteArray(TAllocator, alloc, curNumSegments, oldBackingStore);
        }
    }